

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolveAnalysis.cpp
# Opt level: O0

bool __thiscall HPresolveAnalysis::analysePresolveRuleLog(HPresolveAnalysis *this,bool report)

{
  uint uVar1;
  uint uVar2;
  HighsLogOptions *log_options_;
  reference pvVar3;
  undefined8 uVar4;
  byte in_SIL;
  long *in_RDI;
  vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *this_00;
  HighsInt rule_type_1;
  string rule;
  HighsInt rule_type;
  HighsInt sum_removed_col;
  HighsInt sum_removed_row;
  HighsLogOptions *log_options;
  string local_88 [32];
  int local_68;
  allocator local_51;
  string local_50 [12];
  HighsInt in_stack_ffffffffffffffbc;
  int local_2c;
  uint local_28;
  uint local_24;
  
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    return true;
  }
  log_options_ = (HighsLogOptions *)(in_RDI[1] + 0x380);
  local_24 = 0;
  local_28 = 0;
  for (local_2c = 0; local_2c < 0xe; local_2c = local_2c + 1) {
    pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator[]
                       ((vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *)
                        (in_RDI + 0xd),(long)local_2c);
    local_24 = pvVar3->row_removed + local_24;
    pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator[]
                       ((vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *)
                        (in_RDI + 0xd),(long)local_2c);
    local_28 = pvVar3->col_removed + local_28;
  }
  if (((in_SIL & 1) != 0) && (local_24 + local_28 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,"-------------------------------------------------------",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    uVar4 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,"%s\n",uVar4);
    highsLogDev(log_options_,kInfo,"%-25s      Rows      Cols     Calls\n","Presolve rule removed");
    uVar4 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,"%s\n",uVar4);
    for (local_68 = 0; local_68 < 0xe; local_68 = local_68 + 1) {
      pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator[]
                         ((vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *)
                          (in_RDI + 0xd),(long)local_68);
      if (((pvVar3->call != 0) ||
          (pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::
                    operator[]((vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>
                                *)(in_RDI + 0xd),(long)local_68), pvVar3->row_removed != 0)) ||
         (pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::
                   operator[]((vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *
                              )(in_RDI + 0xd),(long)local_68), pvVar3->col_removed != 0)) {
        utilPresolveRuleTypeToString_abi_cxx11_(in_stack_ffffffffffffffbc);
        uVar4 = std::__cxx11::string::c_str();
        this_00 = (vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *)
                  (in_RDI + 0xd);
        pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::
                 operator[](this_00,(long)local_68);
        uVar1 = pvVar3->row_removed;
        pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::
                 operator[](this_00,(long)local_68);
        uVar2 = pvVar3->col_removed;
        pvVar3 = std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::
                 operator[](this_00,(long)local_68);
        highsLogDev(log_options_,kInfo,"%-25s %9d %9d %9d\n",uVar4,(ulong)uVar1,(ulong)uVar2,
                    pvVar3->call);
        std::__cxx11::string::~string(local_88);
      }
    }
    uVar4 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,"%s\n",uVar4);
    highsLogDev(log_options_,kInfo,"%-25s %9d %9d\n","Total reductions",(ulong)local_24,
                (ulong)local_28);
    uVar4 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,"%s\n",uVar4);
    highsLogDev(log_options_,kInfo,"%-25s %9d %9d\n","Original  model",
                (ulong)*(uint *)((long)in_RDI + 0x2c),(ulong)*(uint *)(in_RDI + 5));
    highsLogDev(log_options_,kInfo,"%-25s %9d %9d\n","Presolved model",
                (ulong)(*(int *)((long)in_RDI + 0x2c) - local_24),(ulong)((int)in_RDI[5] - local_28)
               );
    uVar4 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,"%s\n",uVar4);
    std::__cxx11::string::~string(local_50);
  }
  if ((*(int *)((long)in_RDI + 0x2c) == *(int *)(*in_RDI + 4)) &&
     ((int)in_RDI[5] == *(int *)*in_RDI)) {
    if (local_24 != *(uint *)in_RDI[3]) {
      highsLogDev(log_options_,kError,"%d = sum_removed_row != numDeletedRows = %d\n",
                  (ulong)local_24,(ulong)*(uint *)in_RDI[3]);
      fflush(_stdout);
      return false;
    }
    if (local_28 != *(uint *)in_RDI[4]) {
      highsLogDev(log_options_,kError,"%d = sum_removed_col != numDeletedCols = %d\n",
                  (ulong)local_28,(ulong)*(uint *)in_RDI[4]);
      fflush(_stdout);
      return false;
    }
  }
  return true;
}

Assistant:

bool HPresolveAnalysis::analysePresolveRuleLog(const bool report) {
  if (!allow_logging_) return true;
  const HighsLogOptions& log_options = options->log_options;
  HighsInt sum_removed_row = 0;
  HighsInt sum_removed_col = 0;
  for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
       rule_type++) {
    sum_removed_row += presolve_log_.rule[rule_type].row_removed;
    sum_removed_col += presolve_log_.rule[rule_type].col_removed;
  }
  if (report && sum_removed_row + sum_removed_col) {
    const std::string rule =
        "-------------------------------------------------------";
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    highsLogDev(log_options, HighsLogType::kInfo,
                "%-25s      Rows      Cols     Calls\n",
                "Presolve rule removed");
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
         rule_type++)
      if (presolve_log_.rule[rule_type].call ||
          presolve_log_.rule[rule_type].row_removed ||
          presolve_log_.rule[rule_type].col_removed)
        highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d %9d\n",
                    utilPresolveRuleTypeToString(rule_type).c_str(),
                    (int)presolve_log_.rule[rule_type].row_removed,
                    (int)presolve_log_.rule[rule_type].col_removed,
                    (int)presolve_log_.rule[rule_type].call);
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d\n",
                "Total reductions", (int)sum_removed_row, (int)sum_removed_col);
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
    highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d\n",
                "Original  model", (int)original_num_row_,
                (int)original_num_col_);
    highsLogDev(log_options, HighsLogType::kInfo, "%-25s %9d %9d\n",
                "Presolved model", (int)(original_num_row_ - sum_removed_row),
                (int)(original_num_col_ - sum_removed_col));
    highsLogDev(log_options, HighsLogType::kInfo, "%s\n", rule.c_str());
  }
  if (original_num_row_ == model->num_row_ &&
      original_num_col_ == model->num_col_) {
    if (sum_removed_row != *numDeletedRows) {
      highsLogDev(log_options, HighsLogType::kError,
                  "%d = sum_removed_row != numDeletedRows = %d\n",
                  (int)sum_removed_row, (int)*numDeletedRows);
      fflush(stdout);
      assert(sum_removed_row == *numDeletedRows);
      return false;
    }
    if (sum_removed_col != *numDeletedCols) {
      highsLogDev(log_options, HighsLogType::kError,
                  "%d = sum_removed_col != numDeletedCols = %d\n",
                  (int)sum_removed_col, (int)*numDeletedCols);
      fflush(stdout);
      assert(sum_removed_col == *numDeletedCols);
      return false;
    }
  }
  return true;
}